

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::UnknownFieldParserHelper::ParseLengthDelimited
          (UnknownFieldParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  string *s;
  char *pcVar2;
  pair<const_char_*,_int> pVar3;
  
  s = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(this->unknown_,num);
  bVar1 = *ptr;
  pVar3.second._0_1_ = bVar1;
  pVar3.first = (char *)s;
  pVar3._9_7_ = 0;
  if ((char)bVar1 < '\0') {
    pVar3 = ReadSizeFallback(ptr,(uint)bVar1);
    pcVar2 = pVar3.first;
  }
  else {
    pcVar2 = ptr + 1;
  }
  if (pcVar2 != (char *)0x0) {
    pcVar2 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,pcVar2,pVar3.second,s);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char* ParseLengthDelimited(uint32_t num, const char* ptr,
                                   ParseContext* ctx) {
    std::string* s = unknown_->AddLengthDelimited(num);
    int size = ReadSize(&ptr);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    return ctx->ReadString(ptr, size, s);
  }